

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O2

vector<Omega_h::any,_std::allocator<Omega_h::any>_> *
Omega_h::any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>&>(any *operand)

{
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>(operand);
  if (pvVar1 != (vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_0040f748;
  __cxa_throw(puVar2,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

inline ValueType any_cast(any& operand) {
  auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
  if (p == nullptr) throw bad_any_cast();
  return *p;
}